

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void isoent_free_all(isoent *isoent)

{
  isoent *piVar1;
  isoent *isoent_00;
  bool bVar2;
  
  if (isoent == (isoent *)0x0) {
    return;
  }
LAB_001942aa:
  isoent_00 = isoent;
  if ((isoent->field_0xe8 & 2) != 0) goto code_r0x001942b7;
  goto LAB_001942c0;
code_r0x001942b7:
  piVar1 = (isoent->children).first;
  isoent = piVar1;
  if (piVar1 == (isoent *)0x0) {
LAB_001942c0:
    while (isoent = isoent_00->chnext, isoent == (isoent *)0x0) {
      piVar1 = isoent_00->parent;
      _isoent_free(isoent_00);
      bVar2 = piVar1 == isoent_00;
      isoent_00 = piVar1;
      if (bVar2) {
        return;
      }
    }
    _isoent_free(isoent_00);
  }
  goto LAB_001942aa;
}

Assistant:

static void
isoent_free_all(struct isoent *isoent)
{
	struct isoent *np, *np_temp;

	if (isoent == NULL)
		return;
	np = isoent;
	for (;;) {
		if (np->dir) {
			if (np->children.first != NULL) {
				/* Enter to sub directories. */
				np = np->children.first;
				continue;
			}
		}
		for (;;) {
			np_temp = np;
			if (np->chnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				_isoent_free(np_temp);
				if (np == np_temp)
					return;
			} else {
				np = np->chnext;
				_isoent_free(np_temp);
				break;
			}
		}
	}
}